

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O3

void ELFIO::dump::section_header(ostream *out,Elf_Half no,section *sec,uchar elf_class)

{
  undefined4 uVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  undefined7 in_register_00000009;
  uint *puVar6;
  Elf_Xword flags;
  Elf_Xword flags_00;
  string local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  lVar5 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar5 + -0x18) + 0x10) = 5;
  poVar4 = out + *(long *)(lVar5 + -0x18);
  if ((int)CONCAT71(in_register_00000009,elf_class) == 1) {
    if (out[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
      lVar5 = *(long *)out;
    }
    poVar4[0xe0] = (ostream)0x20;
    *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    lVar5 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x10) = 0x11;
    poVar4 = poVar3 + *(long *)(lVar5 + -0x18);
    if (poVar3[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar3;
    }
    poVar4[0xe0] = (ostream)0x20;
    puVar6 = *(uint **)(lVar5 + -0x18);
    *(uint *)(poVar3 + 0x18 + (long)puVar6) =
         *(uint *)(poVar3 + 0x18 + (long)puVar6) & 0xffffffb5 | 8;
    *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    local_90._M_dataplus._M_p._0_4_ = (*sec->_vptr_section[5])(sec);
    format_assoc<ELFIO::section_type_table_t[33],unsigned_int>
              (&local_50,(dump *)section_type_table,(section_type_table_t (*) [33])&local_90,puVar6)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 8;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x11])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 8;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x13])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 2;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xf])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 3;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x20;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    iVar2 = (*sec->_vptr_section[7])(sec);
    section_flags_abi_cxx11_(&local_90,(dump *)CONCAT44(extraout_var,iVar2),flags);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                (int)local_90._M_dataplus._M_p),
                        local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 2;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xb])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 3;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[9])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 2;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xd])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 0x11;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x20;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    (*sec->_vptr_section[3])(&local_70,sec);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    if (out[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
      lVar5 = *(long *)out;
    }
    poVar4[0xe0] = (ostream)0x20;
    *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
    *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(out + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] ",2);
    lVar5 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x10) = 0x11;
    poVar4 = poVar3 + *(long *)(lVar5 + -0x18);
    if (poVar3[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar3;
    }
    poVar4[0xe0] = (ostream)0x20;
    puVar6 = *(uint **)(lVar5 + -0x18);
    *(uint *)(poVar3 + 0x18 + (long)puVar6) =
         *(uint *)(poVar3 + 0x18 + (long)puVar6) & 0xffffffb5 | 8;
    *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    local_90._M_dataplus._M_p._0_4_ = (*sec->_vptr_section[5])(sec);
    format_assoc<ELFIO::section_type_table_t[33],unsigned_int>
              (&local_50,(dump *)section_type_table,(section_type_table_t (*) [33])&local_90,puVar6)
    ;
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 0x10;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x11])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 0x10;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x13])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 8;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0x17])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 3;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x20;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    iVar2 = (*sec->_vptr_section[7])(sec);
    section_flags_abi_cxx11_(&local_90,(dump *)CONCAT44(extraout_var_00,iVar2),flags_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(char *)CONCAT44(local_90._M_dataplus._M_p._4_4_,
                                                (int)local_90._M_dataplus._M_p),
                        local_90._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    poVar3 = (ostream *)std::ostream::flush();
    lVar5 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x10) = 8;
    poVar4 = poVar3 + *(long *)(lVar5 + -0x18);
    if (poVar3[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar3;
    }
    poVar4[0xe0] = (ostream)0x20;
    *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"0x",2);
    lVar5 = *(long *)poVar3;
    *(undefined8 *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
    poVar4 = poVar3 + *(long *)(lVar5 + -0x18);
    if (poVar3[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar4);
      poVar4[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar3;
    }
    poVar4[0xe0] = (ostream)0x30;
    *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xf])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xb])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[9])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"0x",2);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 4;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x30;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x80;
    (*sec->_vptr_section[0xd])(sec);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"   ",3);
    lVar5 = *(long *)poVar4;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 0x11;
    poVar3 = poVar4 + *(long *)(lVar5 + -0x18);
    if (poVar4[*(long *)(lVar5 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar5 = *(long *)poVar4;
    }
    poVar3[0xe0] = (ostream)0x20;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
         *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xffffff4f | 0x20;
    (*sec->_vptr_section[3])(&local_70,sec);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_70,local_68);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_90._M_dataplus._M_p._4_4_,(int)local_90._M_dataplus._M_p),
                    local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return;
}

Assistant:

static void section_header( std::ostream&  out,
                                Elf_Half       no,
                                const section* sec,
                                unsigned char  elf_class )
    {
        std::ios_base::fmtflags original_flags = out.flags();

        // clang-format off
        if ( elf_class == ELFCLASS32 ) { // Output for 32-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() )
                << " " << DUMP_HEX0x_FORMAT( 8 ) << sec->get_address() << " "
                << DUMP_HEX0x_FORMAT( 8 ) << sec->get_size() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_entry_size() << " "
                << DUMP_STR_FORMAT( 3 ) << section_flags( sec->get_flags() )
                << " " << DUMP_HEX0x_FORMAT( 2 ) << sec->get_link() << " "
                << DUMP_HEX0x_FORMAT( 3 ) << sec->get_info() << " "
                << DUMP_HEX0x_FORMAT( 2 ) << sec->get_addr_align() << " "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name() << " " << std::endl;
        }
        else { // Output for 64-bit
            out << "[" << DUMP_DEC_FORMAT( 5 ) << no << "] "
                << DUMP_STR_FORMAT( 17 ) << str_section_type( sec->get_type() ) << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_address()                  << " "
                << DUMP_HEX0x_FORMAT( 16 ) << sec->get_size()                     << " "
                << DUMP_HEX0x_FORMAT(  8 ) << sec->get_offset()                   << " "
                << DUMP_STR_FORMAT(  3) << section_flags( sec->get_flags() )
                << std::endl
                << DUMP_STR_FORMAT( 8 ) << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_entry_size() << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_link()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_info()       << " "
                << DUMP_HEX0x_FORMAT( 4 ) << sec->get_addr_align() << "   "
                << DUMP_STR_FORMAT( 17 ) << sec->get_name()
                << std::endl;
        }
        // clang-format on

        out.flags( original_flags );

        return;
    }